

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O3

void __thiscall CVmObjIterIdx::set_cur_index(CVmObjIterIdx *this,vm_obj_id_t self,long idx)

{
  uint *puVar1;
  char *pcVar2;
  uint32_t tmp;
  vm_val_t dummy;
  vm_val_t local_20;
  
  if ((G_undo_X != (CVmUndo *)0x0) &&
     (pcVar2 = (this->super_CVmObjIter).super_CVmObject.ext_, (pcVar2[0x11] & 1U) == 0)) {
    local_20.typ = VM_NIL;
    CVmUndo::add_new_record_int_key(G_undo_X,self,*(uint32_t *)(pcVar2 + 5),&local_20);
    puVar1 = (uint *)((this->super_CVmObjIter).super_CVmObject.ext_ + 0x11);
    *puVar1 = *puVar1 | 1;
  }
  *(int *)((this->super_CVmObjIter).super_CVmObject.ext_ + 5) = (int)idx;
  return;
}

Assistant:

void CVmObjIterIdx::set_cur_index(VMG_ vm_obj_id_t self, long idx)
{
    /* save undo if necessary */
    if (G_undo != 0 && !(get_flags() & VMOBJITERIDX_UNDO))
    {
        vm_val_t dummy;
        
        /* 
         *   Add the undo record.  Note that the only information we need
         *   to store is the index value, so we can store this as the key
         *   value - supply a dummy payload, since we have no use for it. 
         */
        dummy.set_nil();
        G_undo->add_new_record_int_key(vmg_ self, get_cur_index(), &dummy);

        /* 
         *   set the undo bit so we don't save redundant undo for this
         *   savepoint 
         */
        set_flags(get_flags() | VMOBJITERIDX_UNDO);
    }

    /* set the index */
    set_cur_index_no_undo(idx);
}